

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::Help(SM_Manager *this,char *relName)

{
  bool bVar1;
  RC RVar2;
  RC RVar3;
  ostream *poVar4;
  IX_IndexHandle local_f9;
  AttrCatEntry *pAStack_f8;
  IX_IndexHandle ih;
  AttrCatEntry *attr;
  char *pData_1;
  char *pData;
  Printer printer;
  DataAttrInfo *attributes;
  undefined1 local_a0 [8];
  RM_Record rec;
  RM_FileScan fs;
  RC rc;
  char *relName_local;
  SM_Manager *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Help\n");
  poVar4 = std::operator<<(poVar4,"   relName=");
  poVar4 = std::operator<<(poVar4,relName);
  std::operator<<(poVar4,"\n");
  RM_FileScan::RM_FileScan((RM_FileScan *)&rec.size);
  RM_Record::RM_Record((RM_Record *)local_a0);
  RVar2 = RM_FileScan::OpenScan
                    ((RM_FileScan *)&rec.size,&this->relcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT);
  if (RVar2 == 0) {
    RVar2 = RM_FileScan::GetNextRec((RM_FileScan *)&rec.size,(RM_Record *)local_a0);
    if (RVar2 == 0x6e) {
      RM_FileScan::CloseScan((RM_FileScan *)&rec.size);
      this_local._4_4_ = 0x12e;
      RVar2 = this_local._4_4_;
    }
    else {
      RM_FileScan::CloseScan((RM_FileScan *)&rec.size);
      printer._32_8_ = malloc(0x198);
      RVar2 = SetUpAttrCatAttributes(this,(DataAttrInfo *)printer._32_8_);
      if (RVar2 == 0) {
        Printer::Printer((Printer *)&pData,(DataAttrInfo *)printer._32_8_,6);
        Printer::PrintHeader((Printer *)&pData,(ostream *)&std::cout);
        RVar2 = RM_FileScan::OpenScan
                          ((RM_FileScan *)&rec.size,&this->attrcatFH,STRING,0x19,0,EQ_OP,relName,
                           NO_HINT);
        if (RVar2 == 0) {
          while (RVar3 = RM_FileScan::GetNextRec((RM_FileScan *)&rec.size,(RM_Record *)local_a0),
                RVar3 != 0x6e) {
            RVar3 = RM_Record::GetData((RM_Record *)local_a0,&pData_1);
            if (RVar3 != 0) goto LAB_00110c65;
            Printer::Print((Printer *)&pData,(ostream *)&std::cout,pData_1);
          }
          RVar2 = RM_FileScan::CloseScan((RM_FileScan *)&rec.size);
          if ((RVar2 == 0) &&
             (fs._92_4_ = RM_FileScan::OpenScan
                                    ((RM_FileScan *)&rec.size,&this->attrcatFH,STRING,0x19,0,EQ_OP,
                                     relName,NO_HINT), RVar2 = fs._92_4_, fs._92_4_ == 0)) {
            do {
              do {
                RVar2 = RM_FileScan::GetNextRec((RM_FileScan *)&rec.size,(RM_Record *)local_a0);
                if (RVar2 == 0x6e) {
                  Printer::PrintFooter((Printer *)&pData,(ostream *)&std::cout);
                  free((void *)printer._32_8_);
                  this_local._4_4_ = 0;
                  RVar2 = this_local._4_4_;
                  goto LAB_00110c65;
                }
                RVar2 = RM_Record::GetData((RM_Record *)local_a0,(char **)&attr);
                if (RVar2 != 0) {
                  this_local._4_4_ = fs._92_4_;
                  RVar2 = this_local._4_4_;
                  goto LAB_00110c65;
                }
              } while (((this->printIndex & 1U) == 0) || (pAStack_f8 = attr, attr->indexNo == -1));
              IX_IndexHandle::IX_IndexHandle(&local_f9);
              fs._92_4_ = IX_Manager::OpenIndex(this->ixm,relName,pAStack_f8->indexNo,&local_f9);
              if (fs._92_4_ == 0) {
                fs._92_4_ = IX_Manager::CloseIndex(this->ixm,&local_f9);
                if (fs._92_4_ == 0) {
                  bVar1 = false;
                }
                else {
                  bVar1 = true;
                  this_local._4_4_ = fs._92_4_;
                }
              }
              else {
                bVar1 = true;
                this_local._4_4_ = fs._92_4_;
              }
              IX_IndexHandle::~IX_IndexHandle(&local_f9);
              RVar2 = this_local._4_4_;
            } while (!bVar1);
          }
        }
LAB_00110c65:
        this_local._4_4_ = RVar2;
        Printer::~Printer((Printer *)&pData);
        RVar2 = this_local._4_4_;
      }
    }
  }
  this_local._4_4_ = RVar2;
  RM_Record::~RM_Record((RM_Record *)local_a0);
  RM_FileScan::~RM_FileScan((RM_FileScan *)&rec.size);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::Help(const char *relName)
{
    cout << "Help\n"
         << "   relName=" << relName << "\n";
  RC rc = 0;
  RM_FileScan fs;
  RM_Record rec;

  // Check that this relation exists:
  if((rc = fs.OpenScan(relcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  if(fs.GetNextRec(rec) == RM_EOF){
    fs.CloseScan();
    return (SM_BADRELNAME);
  }
  fs.CloseScan();
  

  // Sets up the DataAttrInfo for printing
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(6* sizeof(DataAttrInfo));
  if((rc = SetUpAttrCatAttributes(attributes)))
    return (rc);
  Printer printer(attributes, 6);
  printer.PrintHeader(cout);

  // Iterate through attrcat to find all attributes
  // associated with this relation. And print them.
  if((rc = fs.OpenScan(attrcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);

  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    if((rec.GetData(pData)))
      return (rc);
    printer.Print(cout, pData);
  }

  if((rc = fs.CloseScan() ))
    return (rc);

  // If we are to print the index, itereate through again, and print
  // the entire index
  if((rc = fs.OpenScan(attrcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    if((rec.GetData(pData)))
      return (rc);
    if(printIndex){
    AttrCatEntry *attr = (AttrCatEntry*)pData;
      if((attr->indexNo != NO_INDEXES)){
        IX_IndexHandle ih;
        if((rc = ixm.OpenIndex(relName, attr->indexNo, ih)))
          return (rc);
        if((rc = ixm.CloseIndex(ih)))
          return (rc);
      }
    }
  }

  printer.PrintFooter(cout);
  free(attributes);
  return (0);
}